

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O2

int mbedtls_rsa_parse_key(mbedtls_rsa_context *rsa,uchar *key,size_t keylen)

{
  int iVar1;
  int iVar2;
  uchar *end;
  uchar *p;
  mbedtls_mpi T;
  int version;
  size_t len;
  
  mbedtls_mpi_init(&T);
  end = key + keylen;
  p = key;
  iVar1 = mbedtls_asn1_get_tag(&p,end,&len,0x30);
  if ((((iVar1 == 0) && (iVar1 = -0x4080, end == p + len)) &&
      (iVar1 = mbedtls_asn1_get_int(&p,end,&version), iVar1 == 0)) &&
     (iVar1 = -0x4080, version == 0)) {
    iVar1 = asn1_get_nonzero_mpi(&p,end,&T);
    if (((iVar1 == 0) &&
        (iVar1 = mbedtls_rsa_import(rsa,&T,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                    (mbedtls_mpi *)0x0), iVar1 == 0)) &&
       (iVar1 = asn1_get_nonzero_mpi(&p,end,&T), iVar1 == 0)) {
      iVar2 = mbedtls_mpi_copy(&rsa->E,&T);
      iVar1 = iVar2 + -0x4080;
      if ((iVar1 == 0 || iVar2 == 0) && (iVar1 = asn1_get_nonzero_mpi(&p,end,&T), iVar1 == 0)) {
        iVar2 = mbedtls_mpi_copy(&rsa->D,&T);
        iVar1 = iVar2 + -0x4080;
        if ((iVar1 == 0 || iVar2 == 0) && (iVar1 = asn1_get_nonzero_mpi(&p,end,&T), iVar1 == 0)) {
          iVar2 = mbedtls_mpi_copy(&rsa->P,&T);
          iVar1 = iVar2 + -0x4080;
          if ((iVar1 == 0 || iVar2 == 0) && (iVar1 = asn1_get_nonzero_mpi(&p,end,&T), iVar1 == 0)) {
            iVar2 = mbedtls_mpi_copy(&rsa->Q,&T);
            iVar1 = iVar2 + -0x4080;
            if (((iVar1 == 0 || iVar2 == 0) &&
                (((iVar1 = asn1_get_nonzero_mpi(&p,end,&T), iVar1 == 0 &&
                  (iVar1 = mbedtls_mpi_copy(&rsa->DP,&T), iVar1 == 0)) &&
                 (iVar1 = asn1_get_nonzero_mpi(&p,end,&T), iVar1 == 0)))) &&
               ((((iVar1 = mbedtls_mpi_copy(&rsa->DQ,&T), iVar1 == 0 &&
                  (iVar1 = asn1_get_nonzero_mpi(&p,end,&T), iVar1 == 0)) &&
                 ((iVar1 = mbedtls_mpi_copy(&rsa->QP,&T), iVar1 == 0 &&
                  ((iVar1 = mbedtls_rsa_complete(rsa), iVar1 == 0 &&
                   (iVar1 = mbedtls_rsa_check_pubkey(rsa), iVar1 == 0)))))) &&
                (iVar1 = -0x66, p == end)))) {
              iVar1 = 0;
            }
          }
        }
      }
    }
    mbedtls_mpi_free(&T);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      mbedtls_rsa_free(rsa);
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_parse_key(mbedtls_rsa_context *rsa, const unsigned char *key, size_t keylen)
{
    int ret, version;
    size_t len;
    unsigned char *p, *end;

    mbedtls_mpi T;
    mbedtls_mpi_init(&T);

    p = (unsigned char *) key;
    end = p + keylen;

    /*
     * This function parses the RSAPrivateKey (PKCS#1)
     *
     *  RSAPrivateKey ::= SEQUENCE {
     *      version           Version,
     *      modulus           INTEGER,  -- n
     *      publicExponent    INTEGER,  -- e
     *      privateExponent   INTEGER,  -- d
     *      prime1            INTEGER,  -- p
     *      prime2            INTEGER,  -- q
     *      exponent1         INTEGER,  -- d mod (p-1)
     *      exponent2         INTEGER,  -- d mod (q-1)
     *      coefficient       INTEGER,  -- (inverse of q) mod p
     *      otherPrimeInfos   OtherPrimeInfos OPTIONAL
     *  }
     */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if (end != p + len) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if ((ret = mbedtls_asn1_get_int(&p, end, &version)) != 0) {
        return ret;
    }

    if (version != 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /* Import N */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, &T, NULL, NULL,
                                  NULL, NULL)) != 0) {
        goto cleanup;
    }

    /* Import E */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, NULL, NULL, NULL,
                                  NULL, &T)) != 0) {
        goto cleanup;
    }

    /* Import D */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, NULL, NULL, NULL,
                                  &T, NULL)) != 0) {
        goto cleanup;
    }

    /* Import P */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, NULL, &T, NULL,
                                  NULL, NULL)) != 0) {
        goto cleanup;
    }

    /* Import Q */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_rsa_import(rsa, NULL, NULL, &T,
                                  NULL, NULL)) != 0) {
        goto cleanup;
    }

#if !defined(MBEDTLS_RSA_NO_CRT) && !defined(MBEDTLS_RSA_ALT)
    /*
     * The RSA CRT parameters DP, DQ and QP are nominally redundant, in
     * that they can be easily recomputed from D, P and Q. However by
     * parsing them from the PKCS1 structure it is possible to avoid
     * recalculating them which both reduces the overhead of loading
     * RSA private keys into memory and also avoids side channels which
     * can arise when computing those values, since all of D, P, and Q
     * are secret. See https://eprint.iacr.org/2020/055 for a
     * description of one such attack.
     */

    /* Import DP */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_mpi_copy(&rsa->DP, &T)) != 0) {
        goto cleanup;
    }

    /* Import DQ */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_mpi_copy(&rsa->DQ, &T)) != 0) {
        goto cleanup;
    }

    /* Import QP */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = mbedtls_mpi_copy(&rsa->QP, &T)) != 0) {
        goto cleanup;
    }

#else
    /* Verify existence of the CRT params */
    if ((ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0 ||
        (ret = asn1_get_nonzero_mpi(&p, end, &T)) != 0) {
        goto cleanup;
    }
#endif

    /* rsa_complete() doesn't complete anything with the default
     * implementation but is still called:
     * - for the benefit of alternative implementation that may want to
     *   pre-compute stuff beyond what's provided (eg Montgomery factors)
     * - as is also sanity-checks the key
     *
     * Furthermore, we also check the public part for consistency with
     * mbedtls_pk_parse_pubkey(), as it includes size minima for example.
     */
    if ((ret = mbedtls_rsa_complete(rsa)) != 0 ||
        (ret = mbedtls_rsa_check_pubkey(rsa)) != 0) {
        goto cleanup;
    }

    if (p != end) {
        ret = MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

cleanup:

    mbedtls_mpi_free(&T);

    if (ret != 0) {
        mbedtls_rsa_free(rsa);
    }

    return ret;
}